

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O2

Hashtable * __thiscall
icu_63::CanonicalIterator::extract
          (CanonicalIterator *this,Hashtable *fillinResult,UChar32 comp,UChar *segment,
          int32_t segLen,int32_t segmentPos,UErrorCode *status)

{
  int8_t iVar1;
  int iVar2;
  int iVar3;
  undefined8 *value;
  uint srcChar;
  undefined8 uVar4;
  ConstChar16Ptr *srcChars;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  ConstChar16Ptr local_120;
  ConstChar16Ptr local_118;
  UChar *local_110;
  UChar *local_100;
  UnicodeString temp;
  UnicodeString trial;
  UnicodeString decompString;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UnicodeString::UnicodeString(&temp,comp);
    uVar7 = temp.fUnion.fFields.fLength;
    if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
      uVar7 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    decompString.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)&PTR__UnicodeString_003b1268;
    decompString.fUnion.fStackFields.fLengthAndFlags = 2;
    (*(this->nfd->super_UObject)._vptr_UObject[3])();
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((decompString.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if ((decompString.fUnion.fStackFields.fLengthAndFlags & 0x10U) == 0) {
          uVar4 = decompString.fUnion.fFields.fArray;
          if ((decompString.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
            uVar4 = decompString.fUnion.fStackFields.fBuffer;
          }
        }
        else {
          uVar4 = (char16_t *)0x0;
        }
        uVar5 = decompString.fUnion.fFields.fLength;
        if (-1 < decompString.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)decompString.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        uVar8 = (uint)(ushort)*(char16_t *)uVar4;
        iVar3 = 1;
        if (((uVar5 != 1) && ((uVar8 & 0xfc00) == 0xd800)) &&
           (((ushort)*(char16_t *)(uVar4 + 2) & 0xfc00) == 0xdc00)) {
          uVar8 = (uint)(ushort)*(char16_t *)uVar4 * 0x400 + (uint)(ushort)*(char16_t *)(uVar4 + 2)
                  + 0xfca02400;
          iVar3 = 2;
        }
        iVar6 = segmentPos;
        while (iVar2 = iVar3, iVar6 < segLen) {
          iVar3 = iVar6 + 1;
          srcChar = (uint)(ushort)segment[iVar6];
          if ((iVar3 != segLen && (srcChar & 0xfc00) == 0xd800) &&
             (((ushort)segment[iVar3] & 0xfc00) == 0xdc00)) {
            srcChar = (uint)(ushort)segment[iVar6] * 0x400 + (uint)(ushort)segment[iVar3] +
                      0xfca02400;
            iVar3 = iVar6 + 2;
          }
          iVar6 = iVar3;
          if (srcChar == uVar8) {
            if (iVar2 == uVar5) {
              local_118.p_ = segment + iVar6;
              srcChars = &local_118;
              UnicodeString::append(&temp,srcChars,segLen - iVar6);
              local_100 = local_118.p_;
              uVar5 = temp.fUnion.fFields.fLength;
              if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
                uVar5 = (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              if (uVar7 == uVar5) {
                trial.super_Replaceable.super_UObject._vptr_UObject =
                     (UObject)&PTR__UnicodeString_003b1268;
                trial.fUnion.fStackFields.fLengthAndFlags = 2;
                value = (undefined8 *)UMemory::operator_new((UMemory *)0x40,(size_t)srcChars);
                if (value != (undefined8 *)0x0) {
                  *value = &PTR__UnicodeString_003b1268;
                  *(undefined2 *)(value + 1) = 2;
                }
                Hashtable::put(fillinResult,&trial,value,status);
              }
              else {
                trial.super_Replaceable.super_UObject._vptr_UObject =
                     (UObject)&PTR__UnicodeString_003b1268;
                trial.fUnion.fStackFields.fLengthAndFlags = 2;
                (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,&temp,&trial,status);
                if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                  local_120.p_ = segment + segmentPos;
                  iVar1 = UnicodeString::compare(&trial,&local_120,segLen - segmentPos);
                  local_110 = local_120.p_;
                  if (iVar1 == '\0') {
                    if ((temp.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
                      if ((temp.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
                        temp.fUnion.fFields.fArray = temp.fUnion.fStackFields.fBuffer;
                      }
                    }
                    else {
                      temp.fUnion.fFields.fArray = (char16_t *)0x0;
                    }
                    if (-1 < temp.fUnion.fStackFields.fLengthAndFlags) {
                      temp.fUnion.fFields.fLength =
                           (int)temp.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    fillinResult = getEquivalents2(this,fillinResult,
                                                   (char16_t *)
                                                   ((long)temp.fUnion.fFields.fArray +
                                                   (long)(int)uVar7 * 2),
                                                   temp.fUnion.fFields.fLength - uVar7,status);
                    goto LAB_002792ae;
                  }
                }
                fillinResult = (Hashtable *)0x0;
              }
LAB_002792ae:
              UnicodeString::~UnicodeString(&trial);
              goto LAB_0027901d;
            }
            iVar3 = iVar2 + 1;
            uVar8 = (uint)(ushort)*(char16_t *)(uVar4 + (long)iVar2 * 2);
            if ((((uVar8 & 0xfc00) == 0xd800) && (iVar3 != uVar5)) &&
               (((ushort)*(char16_t *)(uVar4 + (long)iVar3 * 2) & 0xfc00) == 0xdc00)) {
              uVar8 = uVar8 * 0x400 + (uint)(ushort)*(char16_t *)(uVar4 + (long)iVar3 * 2) +
                      0xfca02400;
              iVar3 = iVar2 + 2;
            }
          }
          else {
            UnicodeString::append(&temp,srcChar);
            iVar3 = iVar2;
          }
        }
      }
      else {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    fillinResult = (Hashtable *)0x0;
LAB_0027901d:
    UnicodeString::~UnicodeString(&decompString);
    UnicodeString::~UnicodeString(&temp);
  }
  else {
    fillinResult = (Hashtable *)0x0;
  }
  return fillinResult;
}

Assistant:

Hashtable *CanonicalIterator::extract(Hashtable *fillinResult, UChar32 comp, const UChar *segment, int32_t segLen, int32_t segmentPos, UErrorCode &status) {
//Hashtable *CanonicalIterator::extract(UChar32 comp, const UnicodeString &segment, int32_t segLen, int32_t segmentPos, UErrorCode &status) {
    //if (PROGRESS) printf(" extract: %s, ", UToS(Tr(UnicodeString(comp))));
    //if (PROGRESS) printf("%s, %i\n", UToS(Tr(segment)), segmentPos);

    if (U_FAILURE(status)) {
        return NULL;
    }

    UnicodeString temp(comp);
    int32_t inputLen=temp.length();
    UnicodeString decompString;
    nfd.normalize(temp, decompString, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    if (decompString.isBogus()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    const UChar *decomp=decompString.getBuffer();
    int32_t decompLen=decompString.length();

    // See if it matches the start of segment (at segmentPos)
    UBool ok = FALSE;
    UChar32 cp;
    int32_t decompPos = 0;
    UChar32 decompCp;
    U16_NEXT(decomp, decompPos, decompLen, decompCp);

    int32_t i = segmentPos;
    while(i < segLen) {
        U16_NEXT(segment, i, segLen, cp);

        if (cp == decompCp) { // if equal, eat another cp from decomp

            //if (PROGRESS) printf("  matches: %s\n", UToS(Tr(UnicodeString(cp))));

            if (decompPos == decompLen) { // done, have all decomp characters!
                temp.append(segment+i, segLen-i);
                ok = TRUE;
                break;
            }
            U16_NEXT(decomp, decompPos, decompLen, decompCp);
        } else {
            //if (PROGRESS) printf("  buffer: %s\n", UToS(Tr(UnicodeString(cp))));

            // brute force approach
            temp.append(cp);

            /* TODO: optimize
            // since we know that the classes are monotonically increasing, after zero
            // e.g. 0 5 7 9 0 3
            // we can do an optimization
            // there are only a few cases that work: zero, less, same, greater
            // if both classes are the same, we fail
            // if the decomp class < the segment class, we fail

            segClass = getClass(cp);
            if (decompClass <= segClass) return null;
            */
        }
    }
    if (!ok)
        return NULL; // we failed, characters left over

    //if (PROGRESS) printf("Matches\n");

    if (inputLen == temp.length()) {
        fillinResult->put(UnicodeString(), new UnicodeString(), status);
        return fillinResult; // succeed, but no remainder
    }

    // brute force approach
    // check to make sure result is canonically equivalent
    UnicodeString trial;
    nfd.normalize(temp, trial, status);
    if(U_FAILURE(status) || trial.compare(segment+segmentPos, segLen - segmentPos) != 0) {
        return NULL;
    }

    return getEquivalents2(fillinResult, temp.getBuffer()+inputLen, temp.length()-inputLen, status);
}